

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O1

iDynTree * __thiscall
iDynTree::TransformFromDHCraig1989(iDynTree *this,double a,double alpha,double d,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Position local_78 [24];
  Rotation local_60 [72];
  
  dVar1 = cos(theta);
  dVar2 = sin(theta);
  dVar3 = sin(alpha);
  dVar4 = cos(alpha);
  iDynTree::Rotation::Rotation
            (local_60,dVar1,-dVar2,0.0,dVar2 * dVar4,dVar1 * dVar4,-dVar3,dVar2 * dVar3,
             dVar3 * dVar1,dVar4);
  iDynTree::Position::Position(local_78,a,-dVar3 * d,dVar4 * d);
  iDynTree::Transform::Transform((Transform *)this,local_60,local_78);
  return this;
}

Assistant:

Transform TransformFromDHCraig1989(double a,double alpha,double d,double theta)
{
    // returns Modified Denavit-Hartenberg parameters (According to Craig)
    double ct,st,ca,sa;
    ct = cos(theta);
    st = sin(theta);
    sa = sin(alpha);
    ca = cos(alpha);
    return Transform(Rotation(ct,       -st,     0,
                              st*ca,  ct*ca,   -sa,
                              st*sa,  ct*sa,    ca),
                     Position(a, -sa*d, ca*d));
}